

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

vector<calc::Token,_std::allocator<calc::Token>_> *
calc::tokenize(vector<calc::Token,_std::allocator<calc::Token>_> *__return_storage_ptr__,string *str
              )

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  logic_error *this;
  char *pcVar4;
  allocator local_379;
  string local_378 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358 [8];
  string error;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  undefined8 local_328;
  string local_320 [8];
  string wrongExpr;
  allocator<char> local_2fa;
  char local_2f9;
  char *local_2f8;
  undefined8 local_2f0;
  value_type local_2e8;
  Token local_2c0;
  allocator<char> local_292;
  char local_291;
  char *local_290;
  undefined8 local_288;
  value_type local_280;
  Token local_258;
  allocator<char> local_22a;
  char local_229;
  char *local_228;
  undefined8 local_220;
  value_type local_218;
  allocator<char> local_1ea;
  char local_1e9;
  char *local_1e8;
  undefined8 local_1e0;
  value_type local_1d8;
  char local_1ae;
  byte local_1ad;
  char c;
  bool unary;
  istringstream local_1a0 [8];
  istringstream iss;
  string *str_local;
  vector<calc::Token,_std::allocator<calc::Token>_> *result;
  
  std::vector<calc::Token,_std::allocator<calc::Token>_>::vector(__return_storage_ptr__);
  std::__cxx11::istringstream::istringstream(local_1a0,str,8);
  local_1ad = 1;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            do {
              piVar3 = std::operator>>((istream *)local_1a0,&local_1ae);
              bVar1 = std::ios::operator_cast_to_bool
                                ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
              if (!bVar1) {
                std::__cxx11::istringstream::~istringstream(local_1a0);
                return __return_storage_ptr__;
              }
              iVar2 = isspace((int)local_1ae);
            } while (iVar2 != 0);
            if (local_1ae != '(') break;
            local_1e9 = local_1ae;
            local_1e8 = &local_1e9;
            local_1e0 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1d8,local_1e8,local_1e0,&local_1ea);
            local_1d8.type = LEFT_BRACKET;
            std::vector<calc::Token,_std::allocator<calc::Token>_>::push_back
                      (__return_storage_ptr__,&local_1d8);
            Token::~Token(&local_1d8);
            std::allocator<char>::~allocator(&local_1ea);
            local_1ad = 1;
          }
          if (local_1ae != ')') break;
          local_229 = local_1ae;
          local_228 = &local_229;
          local_220 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_218,local_228,local_220,&local_22a);
          local_218.type = RIGHT_BRACKET;
          std::vector<calc::Token,_std::allocator<calc::Token>_>::push_back
                    (__return_storage_ptr__,&local_218);
          Token::~Token(&local_218);
          std::allocator<char>::~allocator(&local_22a);
          local_1ad = 0;
        }
        if ((local_1ae != '-') && (local_1ae != '+')) break;
        bVar1 = (local_1ad & 1) == 0;
        if (bVar1) {
          local_291 = local_1ae;
          local_290 = &local_291;
          local_288 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_280,local_290,local_288,&local_292);
          local_280.type = OPERATION;
          std::vector<calc::Token,_std::allocator<calc::Token>_>::push_back
                    (__return_storage_ptr__,&local_280);
          Token::~Token(&local_280);
          std::allocator<char>::~allocator(&local_292);
          local_1ad = bVar1;
        }
        else {
          anon_unknown.dwarf_13dbf::tokenizeNumber(&local_258,(istream *)local_1a0,local_1ae);
          std::vector<calc::Token,_std::allocator<calc::Token>_>::push_back
                    (__return_storage_ptr__,&local_258);
          Token::~Token(&local_258);
          local_1ad = bVar1;
        }
      }
      iVar2 = isdigit((int)local_1ae);
      if (iVar2 == 0) break;
      anon_unknown.dwarf_13dbf::tokenizeNumber(&local_2c0,(istream *)local_1a0,local_1ae);
      std::vector<calc::Token,_std::allocator<calc::Token>_>::push_back
                (__return_storage_ptr__,&local_2c0);
      Token::~Token(&local_2c0);
      local_1ad = 0;
    }
    if ((local_1ae != '/') && (local_1ae != '*')) break;
    local_2f9 = local_1ae;
    local_2f8 = &local_2f9;
    local_2f0 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,local_2f8,local_2f0,&local_2fa);
    local_2e8.type = OPERATION;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::push_back
              (__return_storage_ptr__,&local_2e8);
    Token::~Token(&local_2e8);
    std::allocator<char>::~allocator(&local_2fa);
    local_1ad = 1;
  }
  std::__cxx11::string::string(local_320);
  std::operator>>((istream *)local_1a0,local_320);
  local_330._M_current =
       (char *)std::begin<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_320);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_328,&local_330);
  std::__cxx11::string::insert(local_320,local_328,(int)local_1ae);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"Incorrect input: ",&local_379);
  std::operator+(local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::logic_error::logic_error(this,pcVar4);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vector<Token> calc::tokenize(string str)
{
	vector<Token> result;

	istringstream iss(move(str));
	bool unary = true;
	char c;
	while (iss >> c)
	{
		if (isspace(c))
		{
			continue;
		}
		else if (c == '(')
		{
			result.push_back({ {c}, TokenType::LEFT_BRACKET });
			unary = true;
		}
		else if (c == ')')
		{
			result.push_back({ {c}, TokenType::RIGHT_BRACKET });
			unary = false;
		}
		else if (c == '-' || c == '+')
		{
			if (unary)
			{
				result.push_back(tokenizeNumber(iss, c));
				unary = false;
			}
			else
			{
				result.push_back({ {c}, TokenType::OPERATION });
				unary = true;
			}
		}
		else if (isdigit(c))
		{
			result.push_back(tokenizeNumber(iss, c));
			unary = false;
		}
		else if (c == '/' || c == '*')
		{
			result.push_back({ {c}, TokenType::OPERATION });
			unary = true;
		}
		else
		{
			string wrongExpr;
			iss >> wrongExpr;
			wrongExpr.insert(begin(wrongExpr), c);
			string error = string("Incorrect input: ") + wrongExpr;
			throw logic_error(error.c_str());
		}
	}

	return result;
}